

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall
Token::Token(Token *this,string *lexeme,TokenType type,unsigned_long line,unsigned_long col)

{
  (this->lexeme)._M_dataplus._M_p = (pointer)&(this->lexeme).field_2;
  (this->lexeme)._M_string_length = 0;
  (this->lexeme).field_2._M_local_buf[0] = '\0';
  this->line = 0;
  this->col = 0;
  this->type = type;
  std::__cxx11::string::_M_assign((string *)&this->lexeme);
  this->line = line;
  this->col = col;
  return;
}

Assistant:

Token(std::string lexeme, TokenType type, unsigned long line, unsigned long col) {
        Token::type = type;
        Token::lexeme = lexeme;
        Token::line = line;
        Token::col = col;
    }